

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DGRMiner.cpp
# Opt level: O2

void dgrminer::getFrequentInitialPatterns
               (set<dgrminer::labeled_edge_with_occurrences,_std::less<dgrminer::labeled_edge_with_occurrences>,_std::allocator<dgrminer::labeled_edge_with_occurrences>_>
                *edges_set,
               vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
               *initial_patterns,
               vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               *initial_patterns_occurrences,int support_as_absolute,bool set_of_graphs,
               PartialUnion *pu)

{
  _Rb_tree_header *__last;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  _Base_ptr p_Var5;
  size_t sVar6;
  _Base_ptr p_Var7;
  set<int,_std::less<int>,_std::allocator<int>_> mapped_occurrences;
  _Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> local_100;
  vector<int,_std::allocator<int>_> occs;
  labeled_edge_with_occurrences f;
  
  p_Var7 = (edges_set->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  __last = &f.occurrences._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)p_Var7 == &(edges_set->_M_t)._M_impl.super__Rb_tree_header) {
      return;
    }
    labeled_edge_with_occurrences::labeled_edge_with_occurrences
              (&f,(labeled_edge_with_occurrences *)(p_Var7 + 1));
    if (set_of_graphs) {
      mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
           mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ &
           0xffffffff00000000;
      mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header;
      mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      for (p_Var5 = f.occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var5 != __last; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5))
      {
        iVar4 = PartialUnion::queryMappingSnapshotsToGraphs(pu,p_Var5[1]._M_color);
        occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)CONCAT44(occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_start._4_4_,iVar4);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        _M_insert_unique<int>
                  ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &mapped_occurrences,(int *)&occs);
      }
      bVar2 = PartialUnion::getNewMeasures(pu);
      bVar1 = (int)mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count <
              support_as_absolute;
      if (bVar2 || bVar1) {
        bVar3 = PartialUnion::getNewMeasures(pu);
        if (bVar3) {
          PartialUnion::getEdges
                    ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                     &local_100,pu);
          bVar3 = PartialUnion::getHeuristicMIS(pu);
          sVar6 = labeled_edge_with_occurrences::support
                            (&f,(vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                                 *)&local_100,true,bVar3);
          if (support_as_absolute <= (int)sVar6) goto LAB_0010554d;
          std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
          ~_Vector_base(&local_100);
        }
      }
      else {
LAB_0010554d:
        iVar4 = f.elements._M_elems[6];
        if ((f.elements._M_elems[1] < 0) && (f.elements._M_elems[4] < 0)) {
          if (bVar2 || bVar1) {
            std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
            ~_Vector_base(&local_100);
          }
          if (iVar4 < 0) goto LAB_00105668;
        }
        else if (bVar2 || bVar1) {
          std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
          ~_Vector_base(&local_100);
        }
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                  (initial_patterns,&f.elements);
        occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
             = (pointer)0x0;
        occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
             = (pointer)0x0;
        occs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        std::__copy_move<false,false,std::bidirectional_iterator_tag>::
        __copy_m<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree_const_iterator<int>)
                   f.occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<int>)__last,&occs);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(initial_patterns_occurrences,&occs);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  (&occs.super__Vector_base<int,_std::allocator<int>_>);
      }
LAB_00105668:
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &mapped_occurrences);
    }
    else {
      PartialUnion::getEdges
                ((vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                 &mapped_occurrences,pu);
      bVar1 = PartialUnion::getNewMeasures(pu);
      bVar2 = PartialUnion::getHeuristicMIS(pu);
      sVar6 = labeled_edge_with_occurrences::support
                        (&f,(vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                            &mapped_occurrences,bVar1,bVar2);
      iVar4 = f.elements._M_elems[6];
      if ((int)sVar6 < support_as_absolute) {
        std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
        ~_Vector_base((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_> *)
                      &mapped_occurrences);
      }
      else {
        if ((f.elements._M_elems[1] < 0) && (f.elements._M_elems[4] < 0)) {
          std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
          ~_Vector_base((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         *)&mapped_occurrences);
          if (iVar4 < 0) goto LAB_00105670;
        }
        else {
          std::_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::
          ~_Vector_base((_Vector_base<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>
                         *)&mapped_occurrences);
        }
        std::vector<std::array<int,_8UL>,_std::allocator<std::array<int,_8UL>_>_>::push_back
                  (initial_patterns,&f.elements);
        mapped_occurrences._M_t._M_impl._0_8_ = 0;
        mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
        mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
        mapped_occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        std::__copy_move<false,false,std::bidirectional_iterator_tag>::
        __copy_m<std::_Rb_tree_const_iterator<int>,std::back_insert_iterator<std::vector<int,std::allocator<int>>>>
                  ((_Rb_tree_const_iterator<int>)
                   f.occurrences._M_t._M_impl.super__Rb_tree_header._M_header._M_left,
                   (_Rb_tree_const_iterator<int>)__last,
                   (vector<int,_std::allocator<int>_> *)&mapped_occurrences);
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::push_back(initial_patterns_occurrences,
                    (vector<int,_std::allocator<int>_> *)&mapped_occurrences);
        std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                  ((_Vector_base<int,_std::allocator<int>_> *)&mapped_occurrences);
      }
    }
LAB_00105670:
    labeled_edge_with_occurrences::~labeled_edge_with_occurrences(&f);
    p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7);
  } while( true );
}

Assistant:

void  getFrequentInitialPatterns(std::set<labeled_edge_with_occurrences> &edges_set,
									std::vector<std::array<int, 8>> &initial_patterns,
									std::vector<std::vector<int>> &initial_patterns_occurrences,
									int support_as_absolute, bool set_of_graphs, PartialUnion &pu)
	{
		for (auto f : edges_set)
		{
			if (set_of_graphs) {
				std::set<int> mapped_occurrences;
				std::set<int>::iterator it2;
				for (it2 = f.occurrences.begin(); it2 != f.occurrences.end(); ++it2)
				{
					mapped_occurrences.insert(pu.queryMappingSnapshotsToGraphs(*it2));
				}
				if (((!pu.getNewMeasures() && static_cast<int>(mapped_occurrences.size()) >= support_as_absolute)
					|| (pu.getNewMeasures() && static_cast<int>(f.support(pu.getEdges(), true, pu.getHeuristicMIS())) >= support_as_absolute)) &&
					(f.elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || f.elements[ADJ_INFO_CHANGETIME] >= 0 ||
					 f.elements[ADJ_INFO_DST_CHANGETIME] >= 0))
				{
					initial_patterns.push_back(f.elements);

					std::vector<int> occs;
					std::copy(f.occurrences.begin(), f.occurrences.end(), std::back_inserter(occs));

					initial_patterns_occurrences.push_back(occs);
				}
			}
			else
			{
				if (static_cast<int>(f.support(pu.getEdges(), pu.getNewMeasures(), pu.getHeuristicMIS())) >= support_as_absolute &&
					(f.elements[ADJ_INFO_SRC_CHANGETIME] >= 0 || f.elements[ADJ_INFO_CHANGETIME] >= 0 ||
					 f.elements[ADJ_INFO_DST_CHANGETIME] >= 0))
				{
					// if the edge represents at least one change
					initial_patterns.push_back(f.elements);

					std::vector<int> occs;
					std::copy(f.occurrences.begin(), f.occurrences.end(), std::back_inserter(occs));

					initial_patterns_occurrences.push_back(occs);
				}
			}
		}
	}